

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_serve_http(mg_connection *nc,http_message *hm,mg_serve_http_opts opts)

{
  int iVar1;
  mg_str *str1;
  mg_str *hdr;
  char path [4096];
  http_message *hm_local;
  mg_connection *nc_local;
  
  path._4088_8_ = hm;
  iVar1 = send_port_based_redirect(nc,hm,&opts);
  if (iVar1 == 0) {
    uri_to_path((http_message *)path._4088_8_,(char *)&hdr,0x1000,&opts);
    mg_send_http_file(nc,(char *)&hdr,0x1000,(http_message *)path._4088_8_,&opts);
    iVar1 = mg_vcmp((mg_str *)(path._4088_8_ + 0x30),"HTTP/1.1");
    if ((iVar1 == 0) &&
       (str1 = mg_get_http_header((http_message *)path._4088_8_,"Connection"), str1 != (mg_str *)0x0
       )) {
      mg_vcmp(str1,"keep-alive");
    }
  }
  return;
}

Assistant:

void mg_serve_http(struct mg_connection *nc, struct http_message *hm,
                   struct mg_serve_http_opts opts) {
    char path[MG_MAX_PATH];
    struct mg_str *hdr;

    if (send_port_based_redirect(nc, hm, &opts)) {
        return;
    }

    if (opts.document_root == NULL) {
        opts.document_root = ".";
    }
    if (opts.per_directory_auth_file == NULL) {
        opts.per_directory_auth_file = ".htpasswd";
    }
    if (opts.enable_directory_listing == NULL) {
        opts.enable_directory_listing = "yes";
    }
    if (opts.cgi_file_pattern == NULL) {
        opts.cgi_file_pattern = "**.cgi$|**.php$";
    }
    if (opts.ssi_pattern == NULL) {
        opts.ssi_pattern = "**.shtml$|**.shtm$";
    }
    if (opts.index_files == NULL) {
        opts.index_files = "index.html,index.htm,index.shtml,index.cgi,index.php";
    }

    uri_to_path(hm, path, sizeof(path), &opts);
    mg_send_http_file(nc, path, sizeof(path), hm, &opts);

    /* Close connection for non-keep-alive requests */
    if (mg_vcmp(&hm->proto, "HTTP/1.1") != 0 ||
        ((hdr = mg_get_http_header(hm, "Connection")) != NULL &&
         mg_vcmp(hdr, "keep-alive") != 0)) {
#if 0
        nc->flags |= MG_F_SEND_AND_CLOSE;
#endif
    }
}